

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_layer_t.h
# Opt level: O3

void __thiscall relu_layer_t::calc_grads(relu_layer_t *this,tensor_t<float> *grad_next_layer)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  int _x;
  int _y;
  float fVar4;
  
  iVar2 = (this->super_layer_t).in.size.x;
  if (0 < iVar2) {
    iVar3 = (this->super_layer_t).in.size.y;
    _x = 0;
    do {
      if (0 < iVar3) {
        iVar2 = (this->super_layer_t).in.size.z;
        _y = 0;
        do {
          if (0 < iVar2) {
            iVar3 = 0;
            do {
              pfVar1 = tensor_t<float>::get(&(this->super_layer_t).in,_x,_y,iVar3);
              fVar4 = 0.0;
              if (0.0 <= *pfVar1) {
                pfVar1 = tensor_t<float>::get(grad_next_layer,_x,_y,iVar3);
                fVar4 = *pfVar1;
              }
              pfVar1 = tensor_t<float>::get(&(this->super_layer_t).grads_in,_x,_y,iVar3);
              *pfVar1 = fVar4;
              iVar3 = iVar3 + 1;
              iVar2 = (this->super_layer_t).in.size.z;
            } while (iVar3 < iVar2);
            iVar3 = (this->super_layer_t).in.size.y;
          }
          _y = _y + 1;
        } while (_y < iVar3);
        iVar2 = (this->super_layer_t).in.size.x;
      }
      _x = _x + 1;
    } while (_x < iVar2);
  }
  return;
}

Assistant:

void calc_grads(tensor_t<float> &grad_next_layer) {
    for (int i = 0; i < in.size.x; i++)
      for (int j = 0; j < in.size.y; j++)
        for (int z = 0; z < in.size.z; z++) {
          grads_in(i, j, z) = (in(i, j, z) < 0) ?
                              (0) :
                              (1 * grad_next_layer(i, j, z));
        }
  }